

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

ncnn_allocator_t ncnn_allocator_create_pool_allocator(void)

{
  ncnn_allocator_t _allocator;
  PoolAllocator_c_api *this;
  
  _allocator = (ncnn_allocator_t)malloc(0x18);
  this = (PoolAllocator_c_api *)operator_new(0x18);
  PoolAllocator_c_api::PoolAllocator_c_api(this,_allocator);
  _allocator->pthis = this;
  _allocator->fast_malloc = __ncnn_PoolAllocator_fast_malloc;
  _allocator->fast_free = __ncnn_PoolAllocator_fast_free;
  return _allocator;
}

Assistant:

ncnn_allocator_t ncnn_allocator_create_pool_allocator()
{
    ncnn_allocator_t allocator = (ncnn_allocator_t)malloc(sizeof(struct __ncnn_allocator_t));
    allocator->pthis = (void*)(new PoolAllocator_c_api(allocator));
    allocator->fast_malloc = __ncnn_PoolAllocator_fast_malloc;
    allocator->fast_free = __ncnn_PoolAllocator_fast_free;
    return allocator;
}